

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::perceiveAuditory(HierarchicalTaskNetworkComponent *this)

{
  bool bVar1;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *this_00;
  reference engram_00;
  Engram *engram;
  iterator __end1;
  iterator __begin1;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range1;
  HierarchicalTaskNetworkComponent *this_local;
  
  this_00 = &(this->state).memory.shortTermMemory;
  __end1 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::begin(this_00);
  engram = (Engram *)std::vector<AI::Engram,_std::allocator<AI::Engram>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                                     *)&engram), bVar1) {
    engram_00 = __gnu_cxx::
                __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                ::operator*(&__end1);
    if ((engram_00->type == Heard) && (engram_00->age < 1)) {
      addEngramToLocus(this,engram_00);
    }
    __gnu_cxx::
    __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::perceiveAuditory()
{
	for(auto& engram : state.memory.shortTermMemory)
	{
		if (engram.type != EngramType::Heard)
			continue;

		if (engram.age > 0)
			continue;

		addEngramToLocus(engram);
	}
}